

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::matrix4d>
          (Attribute *this,double t,matrix4d *dst,TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  optional<tinyusdz::value::matrix4d> local_130;
  undefined1 local_a1 [129];
  
  if (dst == (matrix4d *)0x0) {
    local_130.has_value_ = false;
  }
  else if (((NAN(t)) &&
           ((((this->_var)._blocked != false ||
             (pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0)) ||
            ((uVar2 = (*pvVar1->type_id)(), uVar2 != 0 &&
             ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
              (uVar2 = (*pvVar1->type_id)(), uVar2 != 1)))))))) &&
          (primvar::PrimVar::get_value<tinyusdz::value::matrix4d>(&local_130,&this->_var),
          local_130.has_value_ != false)) {
    memcpy(local_a1,&local_130.contained,0x80);
    memcpy(dst,local_a1,0x80);
    local_130.has_value_ = true;
  }
  else if ((this->_var)._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish ==
           (this->_var)._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start) {
    primvar::PrimVar::get_value<tinyusdz::value::matrix4d>(&local_130,&this->_var);
    if (local_130.has_value_ != false) {
      memcpy(local_a1,&local_130.contained,0x80);
      memcpy(dst,local_a1,0x80);
    }
  }
  else {
    local_130.has_value_ =
         primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4d>
                   (&this->_var,t,tinterp,dst);
  }
  return local_130.has_value_;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }